

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_x86.h
# Opt level: O3

void aom_dc_predictor_32x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  uint8_t *puVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  undefined1 uVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar7 = psadbw(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar8 = psadbw(*(undefined1 (*) [16])(above + 0x10),(undefined1  [16])0x0);
  auVar5 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])left);
  iVar1 = (CONCAT22(auVar5._2_2_ + auVar8._2_2_ + auVar7._2_2_ + auVar5._10_2_ +
                    auVar8._10_2_ + auVar7._10_2_,
                    auVar5._0_2_ + auVar8._0_2_ + auVar7._0_2_ + auVar5._8_2_ +
                    auVar8._8_2_ + auVar7._8_2_) + 0x18U >> 4) * 0x5556;
  uVar6 = (undefined1)((uint)iVar1 >> 0x18);
  uVar3 = (undefined1)((uint)iVar1 >> 0x10);
  auVar5 = ZEXT416(CONCAT22(CONCAT11(uVar6,uVar6),CONCAT11(uVar3,uVar3)));
  auVar5 = pshuflw(auVar5,auVar5,0);
  uVar4 = auVar5._0_4_;
  puVar2 = dst + 0x10;
  iVar1 = 0x10;
  do {
    *(undefined4 *)(puVar2 + -0x10) = uVar4;
    *(undefined4 *)(puVar2 + -0xc) = uVar4;
    *(undefined4 *)(puVar2 + -8) = uVar4;
    *(undefined4 *)(puVar2 + -4) = uVar4;
    *(undefined4 *)puVar2 = uVar4;
    *(undefined4 *)(puVar2 + 4) = uVar4;
    *(undefined4 *)(puVar2 + 8) = uVar4;
    *(undefined4 *)(puVar2 + 0xc) = uVar4;
    puVar2 = puVar2 + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

static inline __m128i dc_sum_32_sse2(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x0 = _mm_add_epi16(x0, x1);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}